

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CheckExtensionDeclarationFieldType
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto,
          string_view type)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  string_view text;
  bool bVar1;
  Descriptor *pDVar2;
  EnumDescriptor *pEVar3;
  DescriptorNames *pDVar4;
  AlphaNum *pAVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar6;
  ulong uVar7;
  string_view prefix;
  string_view type_00;
  string_view element_name;
  string_view type_local;
  string expected_type;
  string actual_type;
  string_view local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  string local_80;
  AlphaNum local_60;
  
  type_local._M_str = type._M_str;
  pAVar5 = (AlphaNum *)type._M_len;
  if (this->had_errors_ != false) {
    return;
  }
  type_local._M_len = (size_t)pAVar5;
  local_b0 = FieldDescriptor::type_name(field);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&actual_type,&local_b0,(allocator<char> *)&local_60);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&expected_type,&type_local,(allocator<char> *)&local_b0);
  pDVar2 = FieldDescriptor::message_type(field);
  if ((pDVar2 != (Descriptor *)0x0) ||
     (pEVar3 = FieldDescriptor::enum_type(field), pcVar6 = extraout_RDX,
     pEVar3 != (EnumDescriptor *)0x0)) {
    if (this->had_errors_ != false) goto LAB_0013ef85;
    pDVar2 = FieldDescriptor::message_type(field);
    if (pDVar2 == (Descriptor *)0x0) {
      pEVar3 = FieldDescriptor::enum_type(field);
      pDVar4 = &pEVar3->all_names_;
    }
    else {
      pDVar2 = FieldDescriptor::message_type(field);
      pDVar4 = &pDVar2->all_names_;
    }
    pcVar6 = pDVar4->payload_;
    uVar7 = (ulong)*(ushort *)(pcVar6 + 2);
    local_b0 = absl::lts_20250127::NullSafeStringView(".");
    local_60.piece_._M_len = uVar7;
    local_60.piece_._M_str = pcVar6 + ~uVar7;
    absl::lts_20250127::StrCat_abi_cxx11_(&local_80,(lts_20250127 *)&local_b0,&local_60,pAVar5);
    std::__cxx11::string::operator=((string *)&actual_type,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    pcVar6 = extraout_RDX_00;
  }
  type_00._M_str = pcVar6;
  type_00._M_len = (size_t)type_local._M_str;
  bVar1 = anon_unknown_24::IsNonMessageType((anon_unknown_24 *)type_local._M_len,type_00);
  if (!bVar1) {
    text._M_str = type_local._M_str;
    text._M_len = type_local._M_len;
    prefix._M_str = ".";
    prefix._M_len = 1;
    pAVar5 = (AlphaNum *)0x2d97d4;
    bVar1 = absl::lts_20250127::StartsWith(text,prefix);
    if (!bVar1) {
      local_b0 = absl::lts_20250127::NullSafeStringView(".");
      local_60.piece_._M_len = type_local._M_len;
      local_60.piece_._M_str = type_local._M_str;
      absl::lts_20250127::StrCat_abi_cxx11_(&local_80,(lts_20250127 *)&local_b0,&local_60,pAVar5);
      std::__cxx11::string::operator=((string *)&expected_type,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  bVar1 = std::operator!=(&expected_type,&actual_type);
  if (bVar1) {
    pcVar6 = (field->all_names_).payload_;
    element_name._M_len = (ulong)*(ushort *)(pcVar6 + 2);
    element_name._M_str = pcVar6 + ~element_name._M_len;
    local_b0._M_str = (char *)&expected_type;
    local_b0._M_len = (size_t)field;
    make_error.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclarationFieldType(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
    ;
    make_error.ptr_.fun = (_func_void *)&local_b0;
    local_a0 = &actual_type;
    AddError(this,element_name,&proto->super_Message,EXTENDEE,make_error);
  }
LAB_0013ef85:
  std::__cxx11::string::~string((string *)&expected_type);
  std::__cxx11::string::~string((string *)&actual_type);
  return;
}

Assistant:

void DescriptorBuilder::CheckExtensionDeclarationFieldType(
    const FieldDescriptor& field, const FieldDescriptorProto& proto,
    absl::string_view type) {
  if (had_errors_) return;
  std::string actual_type(field.type_name());
  std::string expected_type(type);
  if (field.message_type() || field.enum_type()) {
    // Field message type descriptor can be in a partial state which will cause
    // segmentation fault if it is being accessed.
    if (had_errors_) return;
    absl::string_view full_name = field.message_type() != nullptr
                                      ? field.message_type()->full_name()
                                      : field.enum_type()->full_name();
    actual_type = absl::StrCat(".", full_name);
  }
  if (!IsNonMessageType(type) && !absl::StartsWith(type, ".")) {
    expected_type = absl::StrCat(".", type);
  }
  if (expected_type != actual_type) {
    AddError(field.full_name(), proto, DescriptorPool::ErrorCollector::EXTENDEE,
             [&] {
               return absl::Substitute(
                   "\"$0\" extension field $1 is expected to be type "
                   "\"$2\", not \"$3\".",
                   field.containing_type()->full_name(), field.number(),
                   expected_type, actual_type);
             });
  }
}